

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_log(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  double dVar1;
  sexp psVar2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_30 = (sexp)0x43e;
  local_28.var = (sexp_conflict *)0x0;
  local_28.next = (sexp_gc_var_t *)0x0;
  if (((ulong)z & 3) == 0) {
    if (z->tag == 0xb) {
      dVar1 = (z->value).flonum;
      goto LAB_00129958;
    }
    if (z->tag == 0xe) {
      psVar2 = sexp_complex_log(ctx,z);
      return psVar2;
    }
  }
  if (((ulong)z & 1) == 0) {
    if (((ulong)z & 3) != 0) {
LAB_001298ed:
      psVar2 = sexp_type_exception(ctx,self,3,z);
      return psVar2;
    }
    if (z->tag == 0xc) {
      dVar1 = sexp_bignum_to_double(z);
    }
    else {
      if (z->tag != 0xd) goto LAB_001298ed;
      dVar1 = sexp_ratio_to_double(ctx,z);
    }
  }
  else {
    dVar1 = (double)((long)z >> 1);
  }
LAB_00129958:
  if (dVar1 < 0.0) {
    local_28.var = &local_30;
    local_28.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_28;
    local_30 = sexp_make_flonum(ctx,dVar1);
    local_30 = sexp_make_complex(ctx,local_30,(sexp)&DAT_00000001);
    psVar2 = sexp_complex_log(ctx,local_30);
    (ctx->value).context.saves = local_28.next;
    return psVar2;
  }
  dVar1 = log(dVar1);
  psVar2 = sexp_make_flonum(ctx,dVar1);
  return psVar2;
}

Assistant:

sexp sexp_log (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  double d;
#if SEXP_USE_COMPLEX
  sexp_gc_var1(tmp);
  if (sexp_complexp(z))
    return sexp_complex_log(ctx, z);
#endif
  if (sexp_flonump(z))
    d = sexp_flonum_value(z);
  else if (sexp_fixnump(z))
    d = (double)sexp_unbox_fixnum(z);
  maybe_convert_ratio(ctx, z)
  maybe_convert_bignum(z)
  else
    return sexp_type_exception(ctx, self, SEXP_NUMBER, z);
#if SEXP_USE_COMPLEX
  if (d < 0) {
    sexp_gc_preserve1(ctx, tmp);
    tmp = sexp_make_flonum(ctx, d);
    tmp = sexp_make_complex(ctx, tmp, SEXP_ZERO);
    tmp = sexp_complex_log(ctx, tmp);
    sexp_gc_release1(ctx);
    return tmp;
  }
#endif
  return sexp_make_flonum(ctx, log(d));
}